

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O1

bool __thiscall ON_LineCurve::Trim(ON_LineCurve *this,ON_Interval *domain)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  ON_3dPoint q;
  ON_3dPoint p;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  bVar2 = ON_Interval::IsIncreasing(domain);
  if (bVar2) {
    bVar2 = false;
    bVar3 = ON_Interval::Includes(&this->m_t,domain,false);
    if (bVar3) {
      dVar1 = ON_Interval::operator[](domain,0);
      ON_Curve::PointAt(&local_48,&this->super_ON_Curve,dVar1);
      dVar1 = ON_Interval::operator[](domain,1);
      ON_Curve::PointAt(&local_60,&this->super_ON_Curve,dVar1);
      bVar2 = ON_3dPoint::IsCoincident(&local_48,&local_60);
      if (!bVar2) {
        (this->m_line).from.z = local_48.z;
        (this->m_line).from.x = local_48.x;
        (this->m_line).from.y = local_48.y;
        (this->m_line).to.z = local_60.z;
        (this->m_line).to.x = local_60.x;
        (this->m_line).to.y = local_60.y;
        dVar1 = domain->m_t[1];
        (this->m_t).m_t[0] = domain->m_t[0];
        (this->m_t).m_t[1] = dVar1;
        ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
      }
      bVar2 = !bVar2;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_LineCurve::Trim( const ON_Interval& domain )
{
  bool rc = false;
  if ( domain.IsIncreasing() && m_t.Includes(domain) )
  {
    ON_3dPoint p = PointAt( domain[0] );
    ON_3dPoint q = PointAt( domain[1] );
		if( !p.IsCoincident(q)){			
      // 7-May-21 GBA, A successful trim should return an IsValid ON_LineCurve .
			m_line.from = p;
			m_line.to = q;
			m_t = domain;
      DestroyCurveTree();
			rc = true;
		}
  }
  return rc;
}